

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GammaHandler.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
GammaHandler::combineSpectra
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GammaHandler *this,
          double emin,double emax,string *source)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__x;
  RandomGen *pRVar1;
  GammaHandler *this_00;
  double dVar2;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  allocator_type local_99;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  vector<double,_std::allocator<double>_> xyTry;
  double local_58;
  double dStack_50;
  undefined8 local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  sourceInfo;
  
  local_80 = emin;
  local_78 = emax;
  __x = sourceLookupTable((GammaHandler *)__return_storage_ptr__,source);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&sourceInfo,__x);
  pRVar1 = RandomGen::rndm();
  dVar2 = RandomGen::rand_uniform(pRVar1);
  local_58 = (local_78 - local_80) * dVar2 + local_80;
  local_98 = yMax;
  pRVar1 = RandomGen::rndm();
  dStack_50 = RandomGen::rand_uniform(pRVar1);
  dStack_50 = local_98 * dStack_50;
  local_48 = 0x3ff0000000000000;
  this_00 = (GammaHandler *)&xyTry;
  __l._M_len = 3;
  __l._M_array = &local_58;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_00,__l,&local_99);
  local_88 = 0.0;
  local_90 = 0.0;
  dVar2 = 0.0;
  while (0.0 < xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2]) {
    local_90 = photoIonization(this_00,&sourceInfo,&xyTry);
    local_88 = compton(this_00,&sourceInfo,&xyTry);
    local_98 = pairProduction(this_00,&sourceInfo,&xyTry);
    pRVar1 = RandomGen::rndm();
    RandomGen::VonNeumann
              ((vector<double,_std::allocator<double>_> *)&local_58,pRVar1,local_80,local_78,0.0,
               yMax,*xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
               xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1],local_90 + local_88 + local_98);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&xyTry,(GammaHandler *)&local_58);
    this_00 = (GammaHandler *)&local_58;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_58);
    dVar2 = local_98;
  }
  local_58 = -1.0;
  dStack_50 = -1.0;
  local_48 = 0xbff0000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = &local_58;
  local_98 = dVar2;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l_00,&local_99);
  if (0.0 < local_90) {
    *(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
     super__Vector_impl_data._M_start =
         *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
  }
  if (0.0 < local_88) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[1] =
         *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
  }
  if (0.0 < local_98) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[2] =
         *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xyTry.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&sourceInfo);
  return __return_storage_ptr__;
}

Assistant:

const vector<double> GammaHandler::combineSpectra(double emin, double emax,
                                                  string source) {
  double brSum = 0.0;
  double fValue = 0.0;
  double pe = 0.0;
  double compton = 0.0;
  double pp = 0.0;

  vector<vector<double>> sourceInfo = GammaHandler::sourceLookupTable(source);

  vector<double> xyTry = {
      emin + (emax - emin) * RandomGen::rndm()->rand_uniform(),
      yMax * RandomGen::rndm()->rand_uniform(), 1.};

  while (xyTry[2] > 0.) {
    pe = GammaHandler::photoIonization(sourceInfo, xyTry);
    compton = GammaHandler::compton(sourceInfo, xyTry);
    pp = GammaHandler::pairProduction(sourceInfo, xyTry);
    fValue = pe + compton + pp;
    xyTry = RandomGen::rndm()->VonNeumann(emin, emax, 0., yMax, xyTry[0],
                                          xyTry[1], fValue);
  }

  vector<double> keV_vec = {-1, -1, -1};

  if (pe > 0.0) {
    keV_vec[0] = xyTry[0];
  }
  if (compton > 0.0) {
    keV_vec[1] = xyTry[0];
  }
  if (pp > 0.0) {
    keV_vec[2] = xyTry[0];
  }
  return keV_vec;
}